

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::promoteConstantUnion
          (TIntermediate *this,TBasicType promoteTo,TIntermConstantUnion *node)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  uchar uVar5;
  short sVar6;
  unsigned_short uVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  int mc;
  int mr;
  TConstUnionArray *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TConstUnion *pTVar11;
  TConstUnion *pTVar12;
  longlong lVar13;
  unsigned_long_long uVar14;
  undefined4 extraout_var_01;
  long lVar15;
  undefined4 extraout_var_02;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  TType local_f0;
  long *local_58;
  TType *t;
  undefined1 local_48 [4];
  int i;
  TConstUnionArray leftUnionArray;
  int size;
  TConstUnionArray *rightUnionArray;
  TIntermConstantUnion *node_local;
  TBasicType promoteTo_local;
  TIntermediate *this_local;
  
  this_00 = TIntermConstantUnion::getConstArray(node);
  iVar8 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  leftUnionArray.unionArray._4_4_ =
       TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar8));
  TConstUnionArray::TConstUnionArray((TConstUnionArray *)local_48,leftUnionArray.unionArray._4_4_);
  for (t._4_4_ = 0; t._4_4_ < leftUnionArray.unionArray._4_4_; t._4_4_ = t._4_4_ + 1) {
    iVar8 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x38))();
    this_local = (TIntermediate *)node;
    switch(uVar9) {
    case 1:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)(int)dVar16);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)(int)dVar16);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)(int)dVar16);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU16Const(pTVar11,(unsigned_short)(int)dVar16);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setIConst(pTVar11,(int)dVar16);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)(long)dVar16);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI64Const(pTVar11,(long)dVar16);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU64Const
                  (pTVar11,(long)dVar16 |
                           (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setBConst(pTVar11,dVar16 != 0.0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 2:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)(int)dVar16);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)(int)dVar16);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)(int)dVar16);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU16Const(pTVar11,(unsigned_short)(int)dVar16);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setIConst(pTVar11,(int)dVar16);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)(long)dVar16);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI64Const(pTVar11,(long)dVar16);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU64Const
                  (pTVar11,(long)dVar16 |
                           (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setBConst(pTVar11,dVar16 != 0.0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 3:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setDConst(pTVar11,dVar16);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)(int)dVar16);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)(int)dVar16);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)(int)dVar16);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU16Const(pTVar11,(unsigned_short)(int)dVar16);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setIConst(pTVar11,(int)dVar16);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)(long)dVar16);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setI64Const(pTVar11,(long)dVar16);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setU64Const
                  (pTVar11,(long)dVar16 |
                           (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        dVar16 = TConstUnion::getDConst(pTVar12);
        TConstUnion::setBConst(pTVar11,dVar16 != 0.0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 4:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)(int)cVar3);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)(int)cVar3);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)(int)cVar3);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setI8Const(pTVar11,cVar3);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar5 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setU8Const(pTVar11,uVar5);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)cVar3);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setU16Const(pTVar11,(short)cVar3);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setIConst(pTVar11,(int)cVar3);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setUConst(pTVar11,(int)cVar3);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setI64Const(pTVar11,(long)cVar3);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setU64Const(pTVar11,(long)cVar3);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        cVar3 = TConstUnion::getI8Const(pTVar12);
        TConstUnion::setBConst(pTVar11,cVar3 != '\0');
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 5:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)bVar4);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)bVar4);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)bVar4);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar5 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setI8Const(pTVar11,uVar5);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar5 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setU8Const(pTVar11,uVar5);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setI16Const(pTVar11,(ushort)bVar4);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setU16Const(pTVar11,(ushort)bVar4);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setIConst(pTVar11,(uint)bVar4);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)bVar4);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setI64Const(pTVar11,(ulong)bVar4);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar4 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setU64Const(pTVar11,(ulong)bVar4);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar5 = TConstUnion::getU8Const(pTVar12);
        TConstUnion::setBConst(pTVar11,uVar5 != '\0');
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 6:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)(int)sVar6);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)(int)sVar6);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)(int)sVar6);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)sVar6);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)sVar6);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setI16Const(pTVar11,sVar6);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setU16Const(pTVar11,uVar7);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setIConst(pTVar11,(int)sVar6);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setUConst(pTVar11,(int)sVar6);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setI64Const(pTVar11,(long)sVar6);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setU64Const(pTVar11,(long)sVar6);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        sVar6 = TConstUnion::getI16Const(pTVar12);
        TConstUnion::setBConst(pTVar11,sVar6 != 0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 7:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)uVar7);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)uVar7);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)uVar7);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)uVar7);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)uVar7);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setI16Const(pTVar11,uVar7);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setU16Const(pTVar11,uVar7);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setIConst(pTVar11,(uint)uVar7);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)uVar7);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setI64Const(pTVar11,(ulong)uVar7);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setU64Const(pTVar11,(ulong)uVar7);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar7 = TConstUnion::getU16Const(pTVar12);
        TConstUnion::setBConst(pTVar11,uVar7 != 0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 8:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)iVar8);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)iVar8);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)iVar8);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)iVar8);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)iVar8);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)iVar8);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setU16Const(pTVar11,(unsigned_short)iVar8);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setIConst(pTVar11,iVar8);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setUConst(pTVar11,uVar10);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setI64Const(pTVar11,(long)iVar8);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setU64Const(pTVar11,(long)iVar8);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        iVar8 = TConstUnion::getIConst(pTVar12);
        TConstUnion::setBConst(pTVar11,iVar8 != 0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 9:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)uVar10);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)uVar10);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)uVar10);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)uVar10);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)uVar10);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)uVar10);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setU16Const(pTVar11,(unsigned_short)uVar10);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setIConst(pTVar11,uVar10);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setUConst(pTVar11,uVar10);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setI64Const(pTVar11,(ulong)uVar10);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setU64Const(pTVar11,(ulong)uVar10);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar10 = TConstUnion::getUConst(pTVar12);
        TConstUnion::setBConst(pTVar11,uVar10 != 0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 10:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)lVar13);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)lVar13);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)lVar13);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)lVar13);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)lVar13);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)lVar13);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setU16Const(pTVar11,(unsigned_short)lVar13);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setIConst(pTVar11,(int)lVar13);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)lVar13);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setI64Const(pTVar11,lVar13);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setU64Const(pTVar11,uVar14);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        lVar13 = TConstUnion::getI64Const(pTVar12);
        TConstUnion::setBConst(pTVar11,lVar13 != 0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 0xb:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        auVar18._8_4_ = (int)(uVar14 >> 0x20);
        auVar18._0_8_ = uVar14;
        auVar18._12_4_ = 0x45300000;
        TConstUnion::setDConst
                  (pTVar11,(auVar18._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0));
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        auVar19._8_4_ = (int)(uVar14 >> 0x20);
        auVar19._0_8_ = uVar14;
        auVar19._12_4_ = 0x45300000;
        TConstUnion::setDConst
                  (pTVar11,(auVar19._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0));
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        auVar17._8_4_ = (int)(uVar14 >> 0x20);
        auVar17._0_8_ = uVar14;
        auVar17._12_4_ = 0x45300000;
        TConstUnion::setDConst
                  (pTVar11,(auVar17._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0));
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setI8Const(pTVar11,(char)uVar14);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setU8Const(pTVar11,(uchar)uVar14);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setI16Const(pTVar11,(short)uVar14);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setU16Const(pTVar11,(unsigned_short)uVar14);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setIConst(pTVar11,(int)uVar14);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)uVar14);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setI64Const(pTVar11,uVar14);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setU64Const(pTVar11,uVar14);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        uVar14 = TConstUnion::getU64Const(pTVar12);
        TConstUnion::setBConst(pTVar11,uVar14 != 0);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    case 0xc:
      switch(promoteTo) {
      case EbtFloat:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)bVar2);
        break;
      case EbtDouble:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)bVar2);
        break;
      case EbtFloat16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setDConst(pTVar11,(double)bVar2);
        break;
      case EbtInt8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setI8Const(pTVar11,bVar2);
        break;
      case EbtUint8:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setU8Const(pTVar11,bVar2);
        break;
      case EbtInt16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setI16Const(pTVar11,(ushort)bVar2);
        break;
      case EbtUint16:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setU16Const(pTVar11,(ushort)bVar2);
        break;
      case EbtInt:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setIConst(pTVar11,(uint)bVar2);
        break;
      case EbtUint:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setUConst(pTVar11,(uint)bVar2);
        break;
      case EbtInt64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setI64Const(pTVar11,(ulong)bVar2);
        break;
      case EbtUint64:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setU64Const(pTVar11,(ulong)bVar2);
        break;
      case EbtBool:
        pTVar11 = TConstUnionArray::operator[]((TConstUnionArray *)local_48,(long)t._4_4_);
        pTVar12 = TConstUnionArray::operator[](this_00,(long)t._4_4_);
        bVar2 = TConstUnion::getBConst(pTVar12);
        TConstUnion::setBConst(pTVar11,bVar2);
        break;
      default:
        goto switchD_0073a55a_default;
      }
      break;
    default:
      goto switchD_0073a55a_default;
    }
  }
  iVar8 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  local_58 = (long *)CONCAT44(extraout_var_01,iVar8);
  lVar15 = (**(code **)(*local_58 + 0x58))();
  uVar1 = *(undefined8 *)(lVar15 + 8);
  iVar8 = (**(code **)(*local_58 + 0x60))();
  mc = (**(code **)(*local_58 + 0x68))();
  mr = (**(code **)(*local_58 + 0x70))();
  TType::TType(&local_f0,promoteTo,(TStorageQualifier)uVar1 & 0x7f,iVar8,mc,mr,false);
  iVar8 = (**(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
  this_local = (TIntermediate *)
               addConstantUnion(this,(TConstUnionArray *)local_48,&local_f0,
                                (TSourceLoc *)CONCAT44(extraout_var_02,iVar8),false);
  TType::~TType(&local_f0);
switchD_0073a55a_default:
  t._0_4_ = 1;
  TConstUnionArray::~TConstUnionArray((TConstUnionArray *)local_48);
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TIntermediate::promoteConstantUnion(TBasicType promoteTo, TIntermConstantUnion* node) const
{
    const TConstUnionArray& rightUnionArray = node->getConstArray();
    int size = node->getType().computeNumComponents();

    TConstUnionArray leftUnionArray(size);

    for (int i=0; i < size; i++) {

#define PROMOTE(Set, CType, Get) leftUnionArray[i].Set(static_cast<CType>(rightUnionArray[i].Get()))
#define PROMOTE_TO_BOOL(Get) leftUnionArray[i].setBConst(rightUnionArray[i].Get() != 0)

#define TO_ALL(Get)   \
        switch (promoteTo) { \
        case EbtFloat16: PROMOTE(setDConst, double, Get); break; \
        case EbtFloat: PROMOTE(setDConst, double, Get); break; \
        case EbtDouble: PROMOTE(setDConst, double, Get); break; \
        case EbtInt8: PROMOTE(setI8Const, signed char, Get); break; \
        case EbtInt16: PROMOTE(setI16Const, short, Get); break; \
        case EbtInt: PROMOTE(setIConst, int, Get); break; \
        case EbtInt64: PROMOTE(setI64Const, long long, Get); break; \
        case EbtUint8: PROMOTE(setU8Const, unsigned char, Get); break; \
        case EbtUint16: PROMOTE(setU16Const, unsigned short, Get); break; \
        case EbtUint: PROMOTE(setUConst, unsigned int, Get); break; \
        case EbtUint64: PROMOTE(setU64Const, unsigned long long, Get); break; \
        case EbtBool: PROMOTE_TO_BOOL(Get); break; \
        default: return node; \
        }

        switch (node->getType().getBasicType()) {
        case EbtFloat: TO_ALL(getDConst); break;
        case EbtInt: TO_ALL(getIConst); break;
        case EbtUint: TO_ALL(getUConst); break;
        case EbtBool: TO_ALL(getBConst); break;
        case EbtFloat16: TO_ALL(getDConst); break;
        case EbtDouble: TO_ALL(getDConst); break;
        case EbtInt8: TO_ALL(getI8Const); break;
        case EbtInt16: TO_ALL(getI16Const); break;
        case EbtInt64: TO_ALL(getI64Const); break;
        case EbtUint8: TO_ALL(getU8Const); break;
        case EbtUint16: TO_ALL(getU16Const); break;
        case EbtUint64: TO_ALL(getU64Const); break;
        default: return node;
        }
    }

    const TType& t = node->getType();

    return addConstantUnion(leftUnionArray, TType(promoteTo, t.getQualifier().storage, t.getVectorSize(), t.getMatrixCols(), t.getMatrixRows()),
                            node->getLoc());
}